

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O0

void spell_forget(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  CHAR_DATA *in_RCX;
  CHAR_DATA *in_RDX;
  int in_EDI;
  CHAR_DATA *victim;
  AFFECT_DATA af;
  AFFECT_DATA *in_stack_ffffffffffffff68;
  CHAR_DATA *in_stack_ffffffffffffff78;
  char *in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffffa4;
  CHAR_DATA *in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffb0;
  
  bVar1 = is_affected(in_RCX,in_EDI);
  if (bVar1) {
    if (in_RCX == in_RDX) {
      send_to_char(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    }
    else {
      send_to_char(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    }
  }
  else {
    bVar1 = saves_spell(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                        in_stack_ffffffffffffffa4);
    if (bVar1) {
      send_to_char(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    }
    else {
      init_affect((AFFECT_DATA *)0x6205de);
      affect_to_char(in_RCX,in_stack_ffffffffffffff68);
      send_to_char((char *)in_RDX,in_stack_ffffffffffffff78);
      act((char *)in_RDX,in_stack_ffffffffffffff78,in_RCX,in_stack_ffffffffffffff68,0);
    }
  }
  return;
}

Assistant:

void spell_forget(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	AFFECT_DATA af;
	CHAR_DATA *victim = (CHAR_DATA *)vo;

	if (is_affected(victim, sn))
	{
		if (victim == ch)
			send_to_char("You are already as senile as you can get.\n\r", ch);
		else
			send_to_char("They are already affected by a forget spell.\n\r", ch);

		return;
	}

	if (saves_spell(level - 5, victim, DAM_OTHER))
	{
		send_to_char("Spell failed.\n\r", ch);
		return;
	}

	init_affect(&af);
	af.where = TO_AFFECTS;
	af.aftype = AFT_SPELL;
	af.type = sn;
	af.modifier = 0;
	af.owner = ch;
	af.duration = level / 10;
	af.location = 0;
	af.level = level;
	af.mod_name = MOD_CONC;
	affect_to_char(victim, &af);

	send_to_char("You feel your memories slip away.\n\r", victim);
	act("$n suddenly looks disoriented.", victim, 0, 0, TO_ROOM);
}